

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O0

void __thiscall glTF::AssetMetadata::AssetMetadata(AssetMetadata *this)

{
  allocator local_11;
  AssetMetadata *local_10;
  AssetMetadata *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->generator);
  this->premultipliedAlpha = false;
  {unnamed_type#1}::AssetMetadata((_unnamed_type_1_ *)&this->profile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->version,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return;
}

Assistant:

AssetMetadata()
            : premultipliedAlpha(false)
            , version("")
        {
        }